

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O1

int32_t locale_canonKeywordName(char *buf,char *keywordName,UErrorCode *status)

{
  UBool UVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  cVar2 = *keywordName;
  if (cVar2 == '\0') {
    uVar4 = 0;
  }
  else {
    uVar5 = 0;
    do {
      UVar1 = uprv_isASCIILetter_63(cVar2);
      if ((UVar1 == '\0') && (9 < (byte)(keywordName[uVar5] - 0x30U))) goto LAB_002d0c74;
      if (uVar5 == 0x18) {
        *status = U_INTERNAL_PROGRAM_ERROR;
        goto LAB_002d0c82;
      }
      cVar2 = uprv_asciitolower_63(keywordName[uVar5]);
      uVar4 = uVar5 + 1;
      buf[uVar5] = cVar2;
      cVar2 = keywordName[uVar5 + 1];
      uVar5 = uVar4;
    } while (cVar2 != '\0');
  }
  iVar3 = (int)uVar4;
  if (iVar3 == 0) {
LAB_002d0c74:
    *status = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002d0c82:
    iVar3 = 0;
  }
  else {
    buf[uVar4 & 0xffffffff] = '\0';
  }
  return iVar3;
}

Assistant:

static int32_t locale_canonKeywordName(char *buf, const char *keywordName, UErrorCode *status)
{
  int32_t keywordNameLen = 0;

  for (; *keywordName != 0; keywordName++) {
    if (!UPRV_ISALPHANUM(*keywordName)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR; /* malformed keyword name */
      return 0;
    }
    if (keywordNameLen < ULOC_KEYWORD_BUFFER_LEN - 1) {
      buf[keywordNameLen++] = uprv_tolower(*keywordName);
    } else {
      /* keyword name too long for internal buffer */
      *status = U_INTERNAL_PROGRAM_ERROR;
      return 0;
    }
  }
  if (keywordNameLen == 0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR; /* empty keyword name */
    return 0;
  }
  buf[keywordNameLen] = 0; /* terminate */

  return keywordNameLen;
}